

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> * __thiscall
math::wide_integer::uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>::operator-=
          (uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *this,
          uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *other)

{
  uint uVar1;
  uint *r;
  long lVar2;
  
  r = (this->values).
      super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems;
  if (this == other) {
    uVar1 = (this->values).
            super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
            elem_count;
    for (lVar2 = 0; (ulong)uVar1 << 2 != lVar2; lVar2 = lVar2 + 4) {
      *(undefined4 *)((long)r + lVar2) = 0;
    }
  }
  else {
    uintwide_t<2048u,unsigned_int,std::allocator<unsigned_int>,false>::
    eval_subtract_n<unsigned_int*,unsigned_int_const*,unsigned_int_const*>
              (r,r,(other->values).
                   super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                   .elems,0x40,false);
  }
  return this;
}

Assistant:

constexpr auto operator-=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        detail::fill_unsafe(values.begin(), values.end(), static_cast<typename representation_type::value_type>(UINT8_C(0))); // LCOV_EXCL_LINE
      }
      else
      {
        // Unary subtraction function.
        const auto has_borrow = eval_subtract_n(values.begin(),
                                                values.cbegin(),
                                                other.values.cbegin(),
                                                number_of_limbs,
                                                false);

        static_cast<void>(has_borrow);
      }

      return *this;
    }